

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,bool&,char_const(&)[21],int&,char_const(&)[13],char*&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,bool *params,
          char (*params_1) [21],int *params_2,char (*params_3) [13],char **params_4)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000014;
  char (*params_00) [21];
  int *params_01;
  char (*params_02) [13];
  char **params_03;
  long lVar4;
  String argValues [5];
  String *pSVar5;
  undefined8 uVar6;
  String local_a8;
  String local_90;
  String local_78;
  String local_60;
  String local_48;
  
  this->exception = (Exception *)0x0;
  str<bool&>(&local_a8,(kj *)params,(bool *)CONCAT44(in_register_00000014,line));
  str<char_const(&)[21]>(&local_90,(kj *)params_1,params_00);
  str<int&>(&local_78,(kj *)params_2,params_01);
  str<char_const(&)[13]>(&local_60,(kj *)params_3,params_02);
  str<char*&>(&local_48,(kj *)params_4,params_03);
  pSVar5 = &local_a8;
  uVar6 = 5;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x60;
  do {
    lVar1 = *(long *)((long)&local_a8.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_a8.content.size_ + lVar4);
      *(undefined8 *)((long)&local_a8.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_a8.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_a8.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,pSVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}